

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegratorCreator.hpp
# Opt level: O2

void __thiscall
OpenMD::IntegratorBuilder<OpenMD::NPTf>::~IntegratorBuilder(IntegratorBuilder<OpenMD::NPTf> *this)

{
  IntegratorCreator::~IntegratorCreator(&this->super_IntegratorCreator);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual Integrator* create(SimInfo* info) const {
      return new ConcreteIntegrator(info);
    }